

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2dcf93::PointerType::printLeft(PointerType *this,OutputStream *s)

{
  char *pcVar1;
  void *__src;
  bool bVar2;
  char cVar3;
  int iVar4;
  Node *pNVar5;
  size_t sVar6;
  ObjCProtoName *objcProto;
  
  pNVar5 = this->Pointee;
  if (pNVar5->K == KObjCProtoName) {
    bVar2 = ObjCProtoName::isObjCObject((ObjCProtoName *)pNVar5[1]._vptr_Node);
    if (bVar2) {
      OutputStream::grow(s,3);
      pcVar1 = s->Buffer;
      sVar6 = s->CurrentPosition;
      pcVar1[sVar6 + 2] = '<';
      pcVar1 = pcVar1 + sVar6;
      pcVar1[0] = 'i';
      pcVar1[1] = 'd';
      s->CurrentPosition = s->CurrentPosition + 3;
      __src = *(void **)&pNVar5[1].K;
      sVar6 = (long)pNVar5[2]._vptr_Node - (long)__src;
      if (sVar6 != 0) {
        OutputStream::grow(s,sVar6);
        memmove(s->Buffer + s->CurrentPosition,__src,sVar6);
        s->CurrentPosition = s->CurrentPosition + sVar6;
      }
      OutputStream::grow(s,1);
      cVar3 = '>';
      goto LAB_0019344d;
    }
  }
  (*pNVar5->_vptr_Node[4])(pNVar5,s);
  pNVar5 = this->Pointee;
  if (pNVar5->ArrayCache == Yes) {
LAB_001933ca:
    OutputStream::grow(s,1);
    s->Buffer[s->CurrentPosition] = ' ';
    s->CurrentPosition = s->CurrentPosition + 1;
  }
  else if (pNVar5->ArrayCache == Unknown) {
    iVar4 = (*pNVar5->_vptr_Node[1])(pNVar5,s);
    if ((char)iVar4 != '\0') goto LAB_001933ca;
  }
  pNVar5 = this->Pointee;
  if (pNVar5->ArrayCache == Yes) {
LAB_00193422:
    OutputStream::grow(s,1);
    s->Buffer[s->CurrentPosition] = '(';
    s->CurrentPosition = s->CurrentPosition + 1;
  }
  else {
    if (pNVar5->ArrayCache == Unknown) {
      iVar4 = (*pNVar5->_vptr_Node[1])(pNVar5,s);
      if ((char)iVar4 != '\0') goto LAB_00193422;
      pNVar5 = this->Pointee;
    }
    if (pNVar5->FunctionCache == Yes) goto LAB_00193422;
    if (pNVar5->FunctionCache == Unknown) {
      iVar4 = (*pNVar5->_vptr_Node[2])(pNVar5,s);
      if ((char)iVar4 != '\0') goto LAB_00193422;
    }
  }
  OutputStream::grow(s,1);
  cVar3 = '*';
LAB_0019344d:
  s->Buffer[s->CurrentPosition] = cVar3;
  s->CurrentPosition = s->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    // We rewrite objc_object<SomeProtocol>* into id<SomeProtocol>.
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      Pointee->printLeft(s);
      if (Pointee->hasArray(s))
        s += " ";
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += "(";
      s += "*";
    } else {
      const auto *objcProto = static_cast<const ObjCProtoName *>(Pointee);
      s += "id<";
      s += objcProto->Protocol;
      s += ">";
    }
  }